

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# finders.c
# Opt level: O3

double inverf(double x)

{
  double dVar1;
  double dVar2;
  double dVar3;
  
  dVar3 = x;
  do {
    dVar1 = erf(dVar3);
    dVar2 = exp(-dVar3 * dVar3);
    dVar2 = ((dVar1 - x) * 0.8862269254527579) / dVar2;
    dVar3 = dVar3 - dVar2;
  } while (1.1920928955078125e-07 < ABS(dVar2));
  return dVar3;
}

Assistant:

double inverf(double x)
{   // compute the inverse error function via newton's method
    double t = x, dt = 1;
    while (fabs(dt) > FLT_EPSILON)
    {
        dt = 0.5 * sqrt(PI) * (erf(t) - x) / exp(-t*t);
        t -= dt;
    }
    return t;
}